

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllRgbWidget.cpp
# Opt level: O0

void __thiscall AllRgbWidget::SetTargetImage(AllRgbWidget *this,QImage *targetImage)

{
  ulong uVar1;
  QImage *this_00;
  QImage local_48 [24];
  QImage local_30 [24];
  QImage *local_18;
  QImage *targetImage_local;
  AllRgbWidget *this_local;
  
  local_18 = targetImage;
  targetImage_local = (QImage *)this;
  uVar1 = QImage::operator!=(targetImage,(QImage *)&this->target_);
  if ((uVar1 & 1) != 0) {
    this_00 = &this->target_;
    QImage::operator=(this_00,(QImage *)local_18);
    QImage::scaled(local_30,(int)this_00,100,100,FastTransformation);
    QImage::operator=(&this->targetThumbnail_,local_30);
    QImage::~QImage(local_30);
    QImage::QImage(local_48,(QImage *)this_00);
    onTargetUpdated(this,local_48);
    QImage::~QImage(local_48);
    QWidget::update();
  }
  return;
}

Assistant:

void AllRgbWidget::SetTargetImage(const QImage& targetImage)
{
    if (targetImage != target_) {
        target_ = targetImage;
        targetThumbnail_ = target_.scaled(100, 100);
        emit onTargetUpdated(target_);
        update();
    }
}